

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  GCObject *o;
  byte bVar1;
  int iVar2;
  TString **ppTVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  BlockCnt *pBVar8;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VGLOBAL;
    (var->u).s.info = 0xff;
    iVar2 = 8;
  }
  else {
    uVar6 = (ulong)fs->nactvar;
    do {
      uVar7 = uVar6;
      if ((long)uVar7 < 1) {
        iVar2 = singlevaraux(fs->prev,n,var,0);
        if (iVar2 == 8) {
          return 8;
        }
        o = (GCObject *)fs->f;
        iVar2 = (o->p).sizeupvalues;
        bVar1 = (o->p).nups;
        iVar5 = iVar2;
        if ((ulong)bVar1 != 0) {
          uVar6 = 0;
          goto LAB_00111f9c;
        }
        bVar1 = 0;
        goto LAB_00111fe4;
      }
      uVar6 = uVar7 - 1;
    } while (fs->f->locvars[*(ushort *)&fs->upvalues[uVar7 + 0x3b].info].varname != n);
    var->t = -1;
    var->f = -1;
    var->k = VLOCAL;
    (var->u).s.info = (int)(uVar7 - 1);
    iVar2 = 6;
    if (base == 0) {
      pBVar8 = (BlockCnt *)&fs->bl;
      do {
        pBVar8 = pBVar8->previous;
        if (pBVar8 == (BlockCnt *)0x0) {
          return 6;
        }
      } while ((long)uVar7 <= (long)(ulong)pBVar8->nactvar);
      pBVar8->upval = '\x01';
    }
  }
  return iVar2;
  while (uVar6 = uVar6 + 1, bVar1 != uVar6) {
LAB_00111f9c:
    if ((var->k == (uint)fs->upvalues[uVar6].k) &&
       ((var->u).s.info == (uint)fs->upvalues[uVar6].info)) goto LAB_0011208a;
  }
  if (0x3b < bVar1) {
    errorlimit(fs,0x3c,"upvalues");
    bVar1 = (o->p).nups;
    iVar5 = (o->p).sizeupvalues;
  }
LAB_00111fe4:
  if (iVar5 <= (int)(uint)bVar1) {
    ppTVar3 = (TString **)luaM_growaux_(fs->L,(o->p).upvalues,&(o->p).sizeupvalues,8,0x7ffffffd,"");
    (o->p).upvalues = ppTVar3;
    iVar5 = (o->p).sizeupvalues;
  }
  if (iVar2 < iVar5) {
    lVar4 = (long)iVar2;
    do {
      (o->p).upvalues[lVar4] = (TString *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar5 != lVar4);
  }
  bVar1 = (o->p).nups;
  uVar6 = (ulong)bVar1;
  (o->p).upvalues[uVar6] = n;
  if ((((n->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrierf(fs->L,o,(GCObject *)n);
    bVar1 = (o->p).nups;
    uVar6 = (ulong)bVar1;
  }
  fs->upvalues[uVar6].k = (char)var->k;
  fs->upvalues[uVar6].info = *(lu_byte *)&var->u;
  (o->p).nups = bVar1 + 1;
  uVar6 = (ulong)bVar1;
LAB_0011208a:
  (var->u).s.info = (int)uVar6;
  var->k = VUPVAL;
  return 7;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL) {  /* no more levels? */
    init_exp(var, VGLOBAL, NO_REG);  /* default is global variable */
    return VGLOBAL;
  }
  else {
    int v = searchvar(fs, n);  /* look up at current level */
    if (v >= 0) {
      init_exp(var, VLOCAL, v);
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found at current level; try upper one */
      if (singlevaraux(fs->prev, n, var, 0) == VGLOBAL)
        return VGLOBAL;
      var->u.s.info = indexupvalue(fs, n, var);  /* else was LOCAL or UPVAL */
      var->k = VUPVAL;  /* upvalue in this level */
      return VUPVAL;
    }
  }
}